

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *
__thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>::at
          (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
           *this,size_t idx)

{
  pointer pNVar1;
  size_t *psVar2;
  long lVar3;
  ulong uVar4;
  
  while( true ) {
    uVar4 = idx;
    if (uVar4 == 0) {
      return this;
    }
    pNVar1 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar3 = (long)pNVar1 -
            (long)(this->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar3 == 0) break;
    lVar3 = lVar3 >> 4;
    psVar2 = &pNVar1[-1].width;
    while ((this = ((NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                     *)(psVar2 + -1))->pNode,
           this == (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                    *)0x0 || (idx = uVar4 - *psVar2, uVar4 < *psVar2))) {
      lVar3 = lVar3 + -1;
      psVar2 = psVar2 + -2;
      if (lVar3 == 0) {
        return (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                *)0x0;
      }
    }
  }
  return (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
          *)0x0;
}

Assistant:

const Node<T, _Compare> *Node<T, _Compare>::at(size_t idx) const {
    assert(_nodeRefs.height());
    if (idx == 0) {
        return this;
    }
    for (size_t l = _nodeRefs.height(); l-- > 0;) {
        if (_nodeRefs[l].pNode && _nodeRefs[l].width <= idx) {
            return _nodeRefs[l].pNode->at(idx - _nodeRefs[l].width);
        }
    }
    return nullptr;
}